

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_back.hpp
# Opt level: O0

type sl::functional::detail::
     call_bind_back<sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_38()::__1>const&,std::optional<int>>
               (and_then_caller_fn *func,
               tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:234:20)>
               *boundArgsTuple,optional<int> *callArgs)

{
  type tVar1;
  anon_class_16_2_27d33730 local_38;
  optional<int> *local_28;
  optional<int> *callArgs_local;
  tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:234:20)>
  *boundArgsTuple_local;
  and_then_caller_fn *func_local;
  
  local_38.func = func;
  local_38.callArgs = callArgs;
  local_28 = callArgs;
  callArgs_local = (optional<int> *)boundArgsTuple;
  boundArgsTuple_local =
       (tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_tests_nullables_algorithm_cpp:234:20)>
        *)func;
  tVar1 = std::
          apply<sl::functional::detail::call_bind_back<sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_38()::__1>const&,std::optional<int>>(sl::nullables::detail::and_then_caller_fn_const&,std::tuple<CATCH2_INTERNAL_TEST_38()::__1>const&,std::optional<int>&&)::_lambda<typename____T0>((_T0&&)___)_1_,std::tuple<CATCH2_INTERNAL_TEST_38()::__1>const&>
                    (&local_38,boundArgsTuple);
  return (type)(_Optional_payload<int,_true,_true,_true>)
               tVar1.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>;
}

Assistant:

constexpr decltype(auto) call_bind_back(Fn&& func, BoundArgsTuple&& boundArgsTuple, CallArgs&&... callArgs)
	{
		return std::apply(
			[&]<class... TArgs>(TArgs&&... boundArgs) -> decltype(auto)
			{
				return std::invoke(
					std::forward<Fn>(func),
					std::forward<CallArgs>(callArgs)...,
					std::forward<TArgs>(boundArgs)...);
			},
			std::forward<BoundArgsTuple>(boundArgsTuple));
	}